

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  OnlineProofChecker *this_00;
  pointer pcVar1;
  Lit *pLVar2;
  int *piVar3;
  double *pdVar4;
  uint *puVar5;
  char *pcVar6;
  unsigned_long *puVar7;
  pointer piVar8;
  VarData *__ptr;
  lbool *plVar9;
  watchItem *__ptr_00;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_001389a8;
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    OnlineProofChecker::~OnlineProofChecker(this_00);
    operator_delete(this_00);
  }
  this->onlineDratChecker = (OnlineProofChecker *)0x0;
  pcVar1 = (this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ls_best_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  CCNR::ls_solver::~ls_solver(&this->ccnr);
  pLVar2 = (this->involved_lits).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->involved_lits).sz = 0;
    free(pLVar2);
    (this->involved_lits).data = (Lit *)0x0;
    (this->involved_lits).cap = 0;
  }
  piVar3 = (this->pathCs).data;
  if (piVar3 != (int *)0x0) {
    (this->pathCs).sz = 0;
    free(piVar3);
    (this->pathCs).data = (int *)0x0;
    (this->pathCs).cap = 0;
  }
  pdVar4 = (this->var_iLevel_tmp).data;
  if (pdVar4 != (double *)0x0) {
    (this->var_iLevel_tmp).sz = 0;
    free(pdVar4);
    (this->var_iLevel_tmp).data = (double *)0x0;
    (this->var_iLevel_tmp).cap = 0;
  }
  pdVar4 = (this->var_iLevel).data;
  if (pdVar4 != (double *)0x0) {
    (this->var_iLevel).sz = 0;
    free(pdVar4);
    (this->var_iLevel).data = (double *)0x0;
    (this->var_iLevel).cap = 0;
  }
  puVar5 = (this->simplifyBuffer).ring.data;
  if (puVar5 != (uint *)0x0) {
    (this->simplifyBuffer).ring.sz = 0;
    free(puVar5);
    (this->simplifyBuffer).ring.data = (uint *)0x0;
    (this->simplifyBuffer).ring.cap = 0;
  }
  puVar5 = (this->simp_reason_clause).data;
  if (puVar5 != (uint *)0x0) {
    (this->simp_reason_clause).sz = 0;
    free(puVar5);
    (this->simp_reason_clause).data = (uint *)0x0;
    (this->simp_reason_clause).cap = 0;
  }
  pLVar2 = (this->simp_learnt_clause).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->simp_learnt_clause).sz = 0;
    free(pLVar2);
    (this->simp_learnt_clause).data = (Lit *)0x0;
    (this->simp_learnt_clause).cap = 0;
  }
  pcVar6 = (this->check_hit_vec).data;
  if (pcVar6 != (char *)0x0) {
    (this->check_hit_vec).sz = 0;
    free(pcVar6);
    (this->check_hit_vec).data = (char *)0x0;
    (this->check_hit_vec).cap = 0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->O);
  puVar7 = (this->M).data;
  if (puVar7 != (unsigned_long *)0x0) {
    (this->M).sz = 0;
    free(puVar7);
    (this->M).data = (unsigned_long *)0x0;
    (this->M).cap = 0;
  }
  puVar7 = (this->seen2).data;
  if (puVar7 != (unsigned_long *)0x0) {
    (this->seen2).sz = 0;
    free(puVar7);
    (this->seen2).data = (unsigned_long *)0x0;
    (this->seen2).cap = 0;
  }
  pLVar2 = (this->add_oc).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->add_oc).sz = 0;
    free(pLVar2);
    (this->add_oc).data = (Lit *)0x0;
    (this->add_oc).cap = 0;
  }
  pLVar2 = (this->add_tmp).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->add_tmp).sz = 0;
    free(pLVar2);
    (this->add_tmp).data = (Lit *)0x0;
    (this->add_tmp).cap = 0;
  }
  pLVar2 = (this->analyze_toclear).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->analyze_toclear).sz = 0;
    free(pLVar2);
    (this->analyze_toclear).data = (Lit *)0x0;
    (this->analyze_toclear).cap = 0;
  }
  pLVar2 = (this->analyze_stack).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
    free(pLVar2);
    (this->analyze_stack).data = (Lit *)0x0;
    (this->analyze_stack).cap = 0;
  }
  pcVar6 = (this->seen).data;
  if (pcVar6 != (char *)0x0) {
    (this->seen).sz = 0;
    free(pcVar6);
    (this->seen).data = (char *)0x0;
    (this->seen).cap = 0;
  }
  piVar8 = (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar8 != (pointer)0x0) {
    operator_delete(piVar8);
  }
  puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  if (puVar5 != (uint *)0x0) {
    free(puVar5);
  }
  piVar3 = (this->lbd_queue).q.data;
  if (piVar3 != (int *)0x0) {
    (this->lbd_queue).q.sz = 0;
    free(piVar3);
    (this->lbd_queue).q.data = (int *)0x0;
    (this->lbd_queue).q.cap = 0;
  }
  pLVar2 = (this->learnt_clause).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->learnt_clause).sz = 0;
    free(pLVar2);
    (this->learnt_clause).data = (Lit *)0x0;
    (this->learnt_clause).cap = 0;
  }
  pLVar2 = (this->satChecker).check_formula.data;
  if (pLVar2 != (Lit *)0x0) {
    (this->satChecker).check_formula.sz = 0;
    free(pLVar2);
    (this->satChecker).check_formula.data = (Lit *)0x0;
    (this->satChecker).check_formula.cap = 0;
  }
  piVar3 = (this->order_heap_DISTANCE).indices.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_DISTANCE).indices.sz = 0;
    free(piVar3);
    (this->order_heap_DISTANCE).indices.data = (int *)0x0;
    (this->order_heap_DISTANCE).indices.cap = 0;
  }
  piVar3 = (this->order_heap_DISTANCE).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_DISTANCE).heap.sz = 0;
    free(piVar3);
    (this->order_heap_DISTANCE).heap.data = (int *)0x0;
    (this->order_heap_DISTANCE).heap.cap = 0;
  }
  piVar3 = (this->order_heap_CHB).indices.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_CHB).indices.sz = 0;
    free(piVar3);
    (this->order_heap_CHB).indices.data = (int *)0x0;
    (this->order_heap_CHB).indices.cap = 0;
  }
  piVar3 = (this->order_heap_CHB).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_CHB).heap.sz = 0;
    free(piVar3);
    (this->order_heap_CHB).heap.data = (int *)0x0;
    (this->order_heap_CHB).heap.cap = 0;
  }
  piVar3 = (this->order_heap_VSIDS).indices.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_VSIDS).indices.sz = 0;
    free(piVar3);
    (this->order_heap_VSIDS).indices.data = (int *)0x0;
    (this->order_heap_VSIDS).indices.cap = 0;
  }
  piVar3 = (this->order_heap_VSIDS).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap_VSIDS).heap.sz = 0;
    free(piVar3);
    (this->order_heap_VSIDS).heap.data = (int *)0x0;
    (this->order_heap_VSIDS).heap.cap = 0;
  }
  piVar3 = (this->distance_level_incs).data;
  if (piVar3 != (int *)0x0) {
    (this->distance_level_incs).sz = 0;
    free(piVar3);
    (this->distance_level_incs).data = (int *)0x0;
    (this->distance_level_incs).cap = 0;
  }
  piVar3 = (this->decision_rebuild_vars).data;
  if (piVar3 != (int *)0x0) {
    (this->decision_rebuild_vars).sz = 0;
    free(piVar3);
    (this->decision_rebuild_vars).data = (int *)0x0;
    (this->decision_rebuild_vars).cap = 0;
  }
  pLVar2 = (this->assumptions).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->assumptions).sz = 0;
    free(pLVar2);
    (this->assumptions).data = (Lit *)0x0;
    (this->assumptions).cap = 0;
  }
  puVar5 = (this->oldreasons).data;
  if (puVar5 != (uint *)0x0) {
    (this->oldreasons).sz = 0;
    free(puVar5);
    (this->oldreasons).data = (uint *)0x0;
    (this->oldreasons).cap = 0;
  }
  pLVar2 = (this->old_trail).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->old_trail).sz = 0;
    free(pLVar2);
    (this->old_trail).data = (Lit *)0x0;
    (this->old_trail).cap = 0;
  }
  __ptr = (this->vardata).data;
  if (__ptr != (VarData *)0x0) {
    (this->vardata).sz = 0;
    free(__ptr);
    (this->vardata).data = (VarData *)0x0;
    (this->vardata).cap = 0;
  }
  piVar3 = (this->trail_lim).data;
  if (piVar3 != (int *)0x0) {
    (this->trail_lim).sz = 0;
    free(piVar3);
    (this->trail_lim).data = (int *)0x0;
    (this->trail_lim).cap = 0;
  }
  pLVar2 = (this->trail).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->trail).sz = 0;
    free(pLVar2);
    (this->trail).data = (Lit *)0x0;
    (this->trail).cap = 0;
  }
  pcVar6 = (this->decision).data;
  if (pcVar6 != (char *)0x0) {
    (this->decision).sz = 0;
    free(pcVar6);
    (this->decision).data = (char *)0x0;
    (this->decision).cap = 0;
  }
  pcVar6 = (this->polarity).data;
  if (pcVar6 != (char *)0x0) {
    (this->polarity).sz = 0;
    free(pcVar6);
    (this->polarity).data = (char *)0x0;
    (this->polarity).cap = 0;
  }
  plVar9 = (this->assigns).data;
  if (plVar9 != (lbool *)0x0) {
    (this->assigns).sz = 0;
    free(plVar9);
    (this->assigns).data = (lbool *)0x0;
    (this->assigns).cap = 0;
  }
  pLVar2 = (this->watches).dirties.data;
  if (pLVar2 != (Lit *)0x0) {
    (this->watches).dirties.sz = 0;
    free(pLVar2);
    (this->watches).dirties.data = (Lit *)0x0;
    (this->watches).dirties.cap = 0;
  }
  pcVar6 = (this->watches).dirty.data;
  if (pcVar6 != (char *)0x0) {
    (this->watches).dirty.sz = 0;
    free(pcVar6);
    (this->watches).dirty.data = (char *)0x0;
    (this->watches).dirty.cap = 0;
  }
  vec<Minisat::vec<Minisat::Watcher>_>::clear(&(this->watches).occs,true);
  pLVar2 = (this->watches_bin).dirties.data;
  if (pLVar2 != (Lit *)0x0) {
    (this->watches_bin).dirties.sz = 0;
    free(pLVar2);
    (this->watches_bin).dirties.data = (Lit *)0x0;
    (this->watches_bin).dirties.cap = 0;
  }
  pcVar6 = (this->watches_bin).dirty.data;
  if (pcVar6 != (char *)0x0) {
    (this->watches_bin).dirty.sz = 0;
    free(pcVar6);
    (this->watches_bin).dirty.data = (char *)0x0;
    (this->watches_bin).dirty.cap = 0;
  }
  vec<Minisat::vec<Minisat::Watcher>_>::clear(&(this->watches_bin).occs,true);
  pdVar4 = (this->activity_distance).data;
  if (pdVar4 != (double *)0x0) {
    (this->activity_distance).sz = 0;
    free(pdVar4);
    (this->activity_distance).data = (double *)0x0;
    (this->activity_distance).cap = 0;
  }
  pdVar4 = (this->activity_VSIDS).data;
  if (pdVar4 != (double *)0x0) {
    (this->activity_VSIDS).sz = 0;
    free(pdVar4);
    (this->activity_VSIDS).data = (double *)0x0;
    (this->activity_VSIDS).cap = 0;
  }
  pdVar4 = (this->activity_CHB).data;
  if (pdVar4 != (double *)0x0) {
    (this->activity_CHB).sz = 0;
    free(pdVar4);
    (this->activity_CHB).data = (double *)0x0;
    (this->activity_CHB).cap = 0;
  }
  puVar5 = (this->learnts_local).data;
  if (puVar5 != (uint *)0x0) {
    (this->learnts_local).sz = 0;
    free(puVar5);
    (this->learnts_local).data = (uint *)0x0;
    (this->learnts_local).cap = 0;
  }
  puVar5 = (this->learnts_tier2).data;
  if (puVar5 != (uint *)0x0) {
    (this->learnts_tier2).sz = 0;
    free(puVar5);
    (this->learnts_tier2).data = (uint *)0x0;
    (this->learnts_tier2).cap = 0;
  }
  puVar5 = (this->learnts_core).data;
  if (puVar5 != (uint *)0x0) {
    (this->learnts_core).sz = 0;
    free(puVar5);
    (this->learnts_core).data = (uint *)0x0;
    (this->learnts_core).cap = 0;
  }
  puVar5 = (this->clauses).data;
  if (puVar5 != (uint *)0x0) {
    (this->clauses).sz = 0;
    free(puVar5);
    (this->clauses).data = (uint *)0x0;
    (this->clauses).cap = 0;
  }
  __ptr_00 = (this->lazySATwatch).data;
  if (__ptr_00 != (watchItem *)0x0) {
    (this->lazySATwatch).sz = 0;
    free(__ptr_00);
    (this->lazySATwatch).data = (watchItem *)0x0;
    (this->lazySATwatch).cap = 0;
  }
  puVar5 = (this->canceled).data;
  if (puVar5 != (uint *)0x0) {
    (this->canceled).sz = 0;
    free(puVar5);
    (this->canceled).data = (uint *)0x0;
    (this->canceled).cap = 0;
  }
  puVar5 = (this->almost_conflicted).data;
  if (puVar5 != (uint *)0x0) {
    (this->almost_conflicted).sz = 0;
    free(puVar5);
    (this->almost_conflicted).data = (uint *)0x0;
    (this->almost_conflicted).cap = 0;
  }
  puVar5 = (this->conflicted).data;
  if (puVar5 != (uint *)0x0) {
    (this->conflicted).sz = 0;
    free(puVar5);
    (this->conflicted).data = (uint *)0x0;
    (this->conflicted).cap = 0;
  }
  puVar5 = (this->picked).data;
  if (puVar5 != (uint *)0x0) {
    (this->picked).sz = 0;
    free(puVar5);
    (this->picked).data = (uint *)0x0;
    (this->picked).cap = 0;
  }
  pLVar2 = (this->conflict).data;
  if (pLVar2 != (Lit *)0x0) {
    (this->conflict).sz = 0;
    free(pLVar2);
    (this->conflict).data = (Lit *)0x0;
    (this->conflict).cap = 0;
  }
  plVar9 = (this->model).data;
  if (plVar9 != (lbool *)0x0) {
    (this->model).sz = 0;
    free(plVar9);
    (this->model).data = (lbool *)0x0;
    (this->model).cap = 0;
  }
  return;
}

Assistant:

Solver::~Solver()
{
    if (onlineDratChecker) delete onlineDratChecker;
    onlineDratChecker = NULL;
}